

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teststreamclient.cpp
# Opt level: O0

void __thiscall test_timeInfo::test_method(test_timeInfo *this)

{
  bool bVar1;
  Value *this_00;
  Value params_1;
  Value params;
  uint64_t timestamp;
  timeInfo timeInfo;
  Value *in_stack_fffffffffffffcc8;
  undefined1 uVar2;
  Value *in_stack_fffffffffffffcd0;
  assertion_result *paVar3;
  lazy_ostream *in_stack_fffffffffffffcd8;
  lazy_ostream *prev;
  Value *in_stack_fffffffffffffce0;
  undefined1 *puVar4;
  Value *in_stack_fffffffffffffd00;
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  undefined1 local_270 [32];
  undefined1 local_250 [24];
  undefined1 local_238 [16];
  lazy_ostream local_228 [6];
  Value *in_stack_fffffffffffffe38;
  timeInfo *in_stack_fffffffffffffe40;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  undefined1 local_180 [32];
  undefined1 local_160 [24];
  undefined1 local_148 [16];
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  basic_cstring<const_char> local_118;
  undefined1 local_108 [32];
  undefined1 local_e8 [24];
  undefined1 local_d0 [16];
  basic_cstring<const_char> local_c0 [9];
  uint64_t local_28;
  timeInfo local_20;
  
  hbm::streaming::timeInfo::timeInfo(&local_20);
  Json::Value::Value(in_stack_fffffffffffffce0,(ValueType)((ulong)in_stack_fffffffffffffcd8 >> 0x20)
                    );
  Json::Value::Value(in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  Json::Value::operator[](in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  Json::Value::operator[](in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  Json::Value::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  Json::Value::~Value(in_stack_fffffffffffffd00);
  Json::Value::Value(in_stack_fffffffffffffcd0,(Int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
  Json::Value::operator[](in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  Json::Value::operator[](in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  Json::Value::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  Json::Value::~Value(in_stack_fffffffffffffd00);
  hbm::streaming::timeInfo::set(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Json::Value::~Value(in_stack_fffffffffffffd00);
  local_28 = hbm::streaming::timeInfo::ntpTimeStamp(&local_20);
  do {
    paVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    uVar2 = (undefined1)((ulong)in_stack_fffffffffffffcc8 >> 0x38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcd0);
    boost::unit_test::unit_test_log_t::set_checkpoint(paVar3,local_c0,0x31,local_d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffcd0,(bool)uVar2);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,"timestamp==0x0800000000",0x17);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffcd8,(basic_cstring<const_char> *)in_stack_fffffffffffffcd0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
               ,0x60);
    in_stack_fffffffffffffcc8 = (Value *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_e8,local_108,&local_128,0x31,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x11d3c6);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x11d3d3);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  hbm::streaming::timeInfo::clear(&local_20);
  local_28 = hbm::streaming::timeInfo::ntpTimeStamp(&local_20);
  do {
    paVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    uVar2 = (undefined1)((ulong)in_stack_fffffffffffffcc8 >> 0x38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcd0);
    boost::unit_test::unit_test_log_t::set_checkpoint(paVar3,&local_138,0x35,local_148);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffcd0,(bool)uVar2);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,"timestamp==0",0xc);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffcd8,(basic_cstring<const_char> *)in_stack_fffffffffffffcd0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
               ,0x60);
    in_stack_fffffffffffffcc8 = (Value *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_160,local_180,&local_1a0,0x35,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x11d51a);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x11d527);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  Json::Value::Value(in_stack_fffffffffffffce0,(ValueType)((ulong)in_stack_fffffffffffffcd8 >> 0x20)
                    );
  Json::Value::Value(in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  Json::Value::operator[](in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  this_00 = Json::Value::operator[](in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  Json::Value::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  Json::Value::~Value(this_00);
  Json::Value::Value(in_stack_fffffffffffffcd0,(Int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
  Json::Value::operator[](in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  Json::Value::operator[](in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  Json::Value::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  Json::Value::~Value(this_00);
  hbm::streaming::timeInfo::set(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Json::Value::~Value(this_00);
  do {
    uVar2 = (undefined1)((ulong)in_stack_fffffffffffffcc8 >> 0x38);
    prev = local_228;
    paVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)prev,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
               ,0x60);
    puVar4 = local_238;
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)paVar3);
    boost::unit_test::unit_test_log_t::set_checkpoint(paVar3,prev,0x3f,puVar4);
    hbm::streaming::timeInfo::era(&local_20);
    boost::test_tools::assertion_result::assertion_result(paVar3,(bool)uVar2);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,"timeInfo.era()==3",0x11);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)paVar3);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_290,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/test/teststreamclient.cpp"
               ,0x60);
    in_stack_fffffffffffffcc8 = (Value *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_250,local_270,&local_290,0x3f,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x11d756);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x11d763);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE (test_timeInfo)
{
//	}
//		”params”: {
//			"type": "ntp",
//			"era": <number>,
//			"seconds": <number>,
//			"fraction": <number>,
//			"subFraction": <number>
//		}
//	}


	hbm::streaming::timeInfo timeInfo;
	uint64_t timestamp;

	{
		Json::Value params;

		params["stamp"]["type"] = "ntp";
		params["stamp"]["seconds"] = 8;

		timeInfo.set(params);
	}
	timestamp = timeInfo.ntpTimeStamp();
	BOOST_CHECK(timestamp==0x0800000000);

	timeInfo.clear();
	timestamp = timeInfo.ntpTimeStamp();
	BOOST_CHECK(timestamp==0);

	{
		Json::Value params;

		params["stamp"]["type"] = "ntp";
		params["stamp"]["era"] = 3;

		timeInfo.set(params);
	}
	BOOST_CHECK(timeInfo.era()==3);
}